

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

Configurator * __thiscall Clasp::ClaspConfig::Impl::ConfiguratorProxy::ptr(ConfiguratorProxy *this)

{
  int iVar1;
  
  if (ptr()::ptrMask == '\0') {
    iVar1 = __cxa_guard_acquire(&ptr()::ptrMask);
    if (iVar1 != 0) {
      ptr::ptrMask = 0x9fffffffffffffff;
      __cxa_guard_release(&ptr()::ptrMask);
    }
  }
  return (Configurator *)(ptr::ptrMask & this->cfg);
}

Assistant:

Configurator* ptr() const {
			static const uint64 ptrMask = ~(bit_mask<uint64>(OnceBit) | bit_mask<uint64>(AcquireBit));
			return reinterpret_cast<Configurator*>(static_cast<uintp>(cfg & ptrMask));
		}